

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* lest::split_arguments
            (pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *__return_storage_ptr__,texts *args)

{
  pointer pcVar1;
  text *ptVar2;
  int iVar3;
  undefined8 uVar4;
  runtime_error *this;
  long *plVar5;
  size_type *psVar6;
  bool bVar7;
  _Alloc_hider _Var8;
  pointer pbVar9;
  text val;
  text opt;
  text arg;
  texts in;
  int local_24c;
  undefined1 local_248 [32];
  _Alloc_hider local_228;
  pointer local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  ulong local_1f8;
  undefined8 local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined1 *local_1c8;
  long local_1c0;
  undefined1 local_1b8 [16];
  pointer local_1a8;
  pointer pbStack_1a0;
  undefined1 local_198 [32];
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  seed_t local_158;
  undefined8 local_150;
  text local_148;
  text local_128;
  value_type local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  pair<lest::options,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_c8;
  text local_c0;
  text local_a0;
  text local_80;
  runtime_error local_60 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar9 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (pbVar9 == (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    local_24c = 1;
    local_248[5] = 0;
    local_248[6] = 0;
    local_248[7] = 0;
    local_248[8] = 0;
    local_248[9] = 0;
    local_248[10] = 0;
    local_248[0xb] = 0;
    local_248._16_8_ = 0;
    local_248[4] = 0;
    local_248[3] = 0;
    local_248[2] = 0;
    local_248[1] = 0;
    local_248[0] = 0;
  }
  else {
    local_24c = 1;
    bVar7 = true;
    local_1a8 = (pointer)0x0;
    local_1d0 = 0;
    local_1d8 = 0;
    local_1e8 = 0;
    local_1e0 = 0;
    local_158 = 0;
    local_150 = 0;
    local_218.field_2._M_allocated_capacity = 0;
    local_168 = 0;
    local_160 = 0;
    local_218.field_2._8_8_ = 0;
    local_1f8 = 0;
    local_1f0 = 0;
    local_c8 = __return_storage_ptr__;
    do {
      local_198._0_8_ = local_198 + 0x10;
      local_198._8_8_ = 0;
      local_198._16_8_ = local_198._16_8_ & 0xffffffffffffff00;
      local_1c8 = local_1b8;
      local_1c0 = 0;
      local_1b8[0] = 0;
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      pcVar1 = (pbVar9->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_108,pcVar1,pcVar1 + pbVar9->_M_string_length);
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,local_108._M_dataplus._M_p,
                 local_108._M_dataplus._M_p + local_108._M_string_length);
      split_option((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_248,&local_80);
      std::__cxx11::string::operator=((string *)local_198,(string *)local_248);
      std::__cxx11::string::operator=((string *)&local_1c8,(string *)&local_228);
      if ((pointer)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p);
      }
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      if ((bVar7) && (*(char *)local_198._0_8_ == '-')) {
        iVar3 = std::__cxx11::string::compare(local_198);
        if (iVar3 == 0) goto LAB_00106cf6;
        uVar4 = std::__cxx11::string::compare(local_198);
        if ((int)uVar4 == 0) {
LAB_00106d59:
          local_1a8 = (pointer)CONCAT71((int7)((ulong)uVar4 >> 8),1);
LAB_00106d96:
          bVar7 = true;
        }
        else {
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d59;
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) {
LAB_00106d65:
            local_1d0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d65;
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) {
LAB_00106d71:
            local_1d8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d71;
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) {
LAB_00106d7d:
            local_1e0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d7d;
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) {
LAB_00106d86:
            local_1e8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d86;
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) {
LAB_00106d8f:
            local_1f0 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
          uVar4 = std::__cxx11::string::compare(local_198);
          if ((int)uVar4 == 0) goto LAB_00106d8f;
          uVar4 = std::__cxx11::string::compare(local_198);
          bVar7 = true;
          if ((int)uVar4 != 0) {
            uVar4 = std::__cxx11::string::compare(local_198);
            if ((int)uVar4 == 0) goto LAB_00106d9d;
            uVar4 = std::__cxx11::string::compare(local_198);
            if ((int)uVar4 != 0) {
              uVar4 = std::__cxx11::string::compare(local_198);
              if ((int)uVar4 == 0) goto LAB_00106da9;
              uVar4 = std::__cxx11::string::compare(local_198);
              if ((int)uVar4 == 0) {
LAB_00106db2:
                local_218.field_2._M_allocated_capacity = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                goto LAB_00106d96;
              }
              uVar4 = std::__cxx11::string::compare(local_198);
              if ((int)uVar4 == 0) goto LAB_00106db2;
              uVar4 = std::__cxx11::string::compare(local_198);
              bVar7 = true;
              if ((int)uVar4 != 0) {
                iVar3 = std::__cxx11::string::compare(local_198);
                if (iVar3 == 0) {
                  iVar3 = std::__cxx11::string::compare((char *)&local_1c8);
                  if (iVar3 == 0) goto LAB_00106cf8;
                }
                iVar3 = std::__cxx11::string::compare(local_198);
                if (iVar3 != 0) {
LAB_00106c10:
                  iVar3 = std::__cxx11::string::compare(local_198);
                  if (iVar3 == 0) {
                    uVar4 = std::__cxx11::string::compare((char *)&local_1c8);
                    if ((int)uVar4 == 0) {
                      local_168 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                      goto LAB_00106d96;
                    }
                  }
                  iVar3 = std::__cxx11::string::compare(local_198);
                  if (iVar3 == 0) {
                    local_248._0_8_ = local_248 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_248,"--random-seed","");
                    local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
                    if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
                      local_128.field_2._8_4_ = local_248._24_4_;
                      local_128.field_2._12_4_ = local_248._28_4_;
                    }
                    else {
                      local_128._M_dataplus._M_p = (pointer)local_248._0_8_;
                    }
                    local_128.field_2._M_allocated_capacity = local_248._16_8_;
                    local_128._M_string_length = local_248._8_8_;
                    local_248._8_8_ = 0;
                    local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
                    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
                    local_248._0_8_ = local_248 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_a0,local_1c8,local_1c8 + local_1c0);
                    local_158 = seed(&local_128,&local_a0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
                      operator_delete(local_a0._M_dataplus._M_p);
                    }
                    ptVar2 = &local_128;
                    _Var8._M_p = local_128._M_dataplus._M_p;
                  }
                  else {
                    iVar3 = std::__cxx11::string::compare(local_198);
                    if (iVar3 != 0) {
                      this = (runtime_error *)__cxa_allocate_exception(0x10);
                      std::operator+(&local_50,"unrecognised option \'",
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_198);
                      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
                      local_248._0_8_ = *plVar5;
                      psVar6 = (size_type *)(plVar5 + 2);
                      if ((size_type *)local_248._0_8_ == psVar6) {
                        local_248._16_8_ = *psVar6;
                        local_248._24_8_ = plVar5[3];
                        local_248._0_8_ = local_248 + 0x10;
                      }
                      else {
                        local_248._16_8_ = *psVar6;
                      }
                      local_248._8_8_ = plVar5[1];
                      *plVar5 = (long)psVar6;
                      plVar5[1] = 0;
                      *(undefined1 *)(plVar5 + 2) = 0;
                      std::runtime_error::runtime_error(local_60,(string *)local_248);
                      std::runtime_error::runtime_error(this,local_60);
                      __cxa_throw(this,&std::runtime_error::typeinfo,
                                  std::runtime_error::~runtime_error);
                    }
                    local_248._0_8_ = local_248 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_248,"--repeat","");
                    local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
                    if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
                      local_148.field_2._8_4_ = local_248._24_4_;
                      local_148.field_2._12_4_ = local_248._28_4_;
                    }
                    else {
                      local_148._M_dataplus._M_p = (pointer)local_248._0_8_;
                    }
                    local_148.field_2._M_allocated_capacity = local_248._16_8_;
                    local_148._M_string_length = local_248._8_8_;
                    local_248._8_8_ = 0;
                    local_248._16_8_ = local_248._16_8_ & 0xffffffffffffff00;
                    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
                    local_248._0_8_ = local_248 + 0x10;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_c0,local_1c8,local_1c8 + local_1c0);
                    local_24c = repeat(&local_148,&local_c0);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
                      operator_delete(local_c0._M_dataplus._M_p);
                    }
                    ptVar2 = &local_148;
                    _Var8._M_p = local_148._M_dataplus._M_p;
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)_Var8._M_p != &ptVar2->field_2) {
                    operator_delete(_Var8._M_p);
                  }
                  if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
                    operator_delete((void *)local_248._0_8_);
                  }
                  goto LAB_00106cf8;
                }
                uVar4 = std::__cxx11::string::compare((char *)&local_1c8);
                if ((int)uVar4 != 0) goto LAB_00106c10;
                local_160 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
                goto LAB_00106d96;
              }
              local_150 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
              goto LAB_00106cf8;
            }
LAB_00106da9:
            local_218.field_2._8_8_ = CONCAT71((int7)((ulong)uVar4 >> 8),1);
            goto LAB_00106d96;
          }
LAB_00106d9d:
          local_1f8 = CONCAT71((int7)((ulong)uVar4 >> 8),1);
        }
      }
      else {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_e8,&local_108);
LAB_00106cf6:
        bVar7 = false;
      }
LAB_00106cf8:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      if (local_1c8 != local_1b8) {
        operator_delete(local_1c8);
      }
      if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
        operator_delete((void *)local_198._0_8_);
      }
      pbVar9 = pbVar9 + 1;
    } while (pbVar9 != (args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
    local_248[7] = (undefined1)local_218.field_2._8_8_;
    local_248[6] = 1;
    if ((local_1f8 & 1) == 0) {
      local_248[6] = local_248[7];
    }
    local_248[9] = (undefined1)local_168;
    local_248[10] = (undefined1)local_218.field_2._M_allocated_capacity;
    local_248[8] = (undefined1)local_160;
    local_248[5] = (undefined1)local_1f0;
    local_248[0xb] = (undefined1)local_150;
    local_248[4] = (undefined1)local_1e0;
    local_248[3] = (undefined1)local_1e8;
    local_248[2] = (undefined1)local_1d8;
    local_248[1] = (undefined1)local_1d0;
    local_248[0] = SUB81(local_1a8,0);
    local_248._16_8_ = local_158;
    __return_storage_ptr__ = local_c8;
  }
  local_248._12_4_ = local_24c;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_248 + 0x18),&local_e8);
  pbVar9 = local_220;
  local_198._16_8_ = local_248._16_8_;
  local_198._0_8_ = local_248._0_8_;
  local_198._8_8_ = local_248._8_8_;
  local_1a8 = (pointer)local_248._24_8_;
  pbStack_1a0 = (pointer)local_228._M_p;
  local_220 = (pointer)0x0;
  local_248._24_8_ = 0;
  local_228._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_248 + 0x18));
  (__return_storage_ptr__->first).seed = local_198._16_8_;
  (__return_storage_ptr__->first).help = (bool)local_198[0];
  (__return_storage_ptr__->first).abort = (bool)local_198[1];
  (__return_storage_ptr__->first).count = (bool)local_198[2];
  (__return_storage_ptr__->first).list = (bool)local_198[3];
  (__return_storage_ptr__->first).tags = (bool)local_198[4];
  (__return_storage_ptr__->first).time = (bool)local_198[5];
  (__return_storage_ptr__->first).pass = (bool)local_198[6];
  (__return_storage_ptr__->first).zen = (bool)local_198[7];
  (__return_storage_ptr__->first).lexical = (bool)local_198[8];
  (__return_storage_ptr__->first).random = (bool)local_198[9];
  (__return_storage_ptr__->first).verbose = (bool)local_198[10];
  (__return_storage_ptr__->first).version = (bool)local_198[0xb];
  (__return_storage_ptr__->first).repeat = local_198._12_4_;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = local_1a8;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = pbStack_1a0;
  (__return_storage_ptr__->second).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = pbVar9;
  local_170 = 0;
  local_198._24_8_ = 0;
  uStack_178 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_198 + 0x18));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e8);
  return __return_storage_ptr__;
}

Assistant:

inline std::pair<options, texts>
split_arguments( texts args )
{
    options option; texts in;

    bool in_options = true;

    for ( texts::iterator pos = args.begin(); pos != args.end() ; ++pos )
    {
        text opt, val, arg = *pos;
        tie( opt, val ) = split_option( arg );

        if ( in_options )
        {
            if      ( opt[0] != '-'                             ) { in_options     = false;           }
            else if ( opt == "--"                               ) { in_options     = false; continue; }
            else if ( opt == "-h"      || "--help"       == opt ) { option.help    =  true; continue; }
            else if ( opt == "-a"      || "--abort"      == opt ) { option.abort   =  true; continue; }
            else if ( opt == "-c"      || "--count"      == opt ) { option.count   =  true; continue; }
            else if ( opt == "-g"      || "--list-tags"  == opt ) { option.tags    =  true; continue; }
            else if ( opt == "-l"      || "--list-tests" == opt ) { option.list    =  true; continue; }
            else if ( opt == "-t"      || "--time"       == opt ) { option.time    =  true; continue; }
            else if ( opt == "-p"      || "--pass"       == opt ) { option.pass    =  true; continue; }
            else if ( opt == "-z"      || "--pass-zen"   == opt ) { option.zen     =  true; continue; }
            else if ( opt == "-v"      || "--verbose"    == opt ) { option.verbose =  true; continue; }
            else if (                     "--version"    == opt ) { option.version =  true; continue; }
            else if ( opt == "--order" && "declared"     == val ) { /* by definition */   ; continue; }
            else if ( opt == "--order" && "lexical"      == val ) { option.lexical =  true; continue; }
            else if ( opt == "--order" && "random"       == val ) { option.random  =  true; continue; }
            else if ( opt == "--random-seed" ) { option.seed   = seed  ( "--random-seed", val ); continue; }
            else if ( opt == "--repeat"      ) { option.repeat = repeat( "--repeat"     , val ); continue; }
            else throw std::runtime_error( "unrecognised option '" + opt + "' (try option --help)" );
        }
        in.push_back( arg );
    }
    option.pass = option.pass || option.zen;

    return std::make_pair( option, in );
}